

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdtext.c
# Opt level: O2

int cueify_cdtext_deserialize(cueify_cdtext *t,uint8_t *buffer,size_t size)

{
  byte bVar1;
  byte *pbVar2;
  ushort *puVar3;
  long lVar4;
  ushort uVar5;
  uchar *(*papuVar6) [16];
  byte *pbVar7;
  uchar *puVar8;
  char *pcVar9;
  char *pcVar10;
  size_t sVar11;
  char *pcVar12;
  void *pvVar13;
  size_t (*pasVar14) [16];
  long lVar15;
  ulong uVar16;
  byte *pbVar17;
  long lVar18;
  long lVar19;
  cueify_cdtext *ppvVar20;
  ulong uVar21;
  byte *pbVar22;
  int iVar23;
  cueify_cdtext *local_8c0;
  uchar *pack_data [8] [16];
  size_t pack_sizes [8] [16];
  
  if (buffer == (uint8_t *)0x0 || t == (cueify_cdtext *)0x0) {
    iVar23 = 3;
  }
  else {
    iVar23 = 6;
    if ((3 < size) &&
       (uVar5 = *(ushort *)buffer << 8 | *(ushort *)buffer >> 8, (ulong)uVar5 <= size - 2)) {
      iVar23 = uVar5 - 2;
      if (iVar23 % 0x12 == 0) {
        papuVar6 = pack_data;
        pasVar14 = pack_sizes;
        for (lVar15 = 0; lVar15 != 8; lVar15 = lVar15 + 1) {
          for (lVar18 = 0; lVar18 != 0x10; lVar18 = lVar18 + 1) {
            (*papuVar6)[lVar18] = (uchar *)0x0;
            (*pasVar14)[lVar18] = 0;
          }
          papuVar6 = papuVar6 + 1;
          pasVar14 = pasVar14 + 1;
        }
        ppvVar20 = t + 0x2be;
        for (lVar15 = 0; lVar15 != 100; lVar15 = lVar15 + 1) {
          for (lVar18 = 0; lVar18 != 0xc940; lVar18 = lVar18 + 0x1928) {
            free(*(void **)((long)ppvVar20 + lVar18 + -0x15e0));
            *(undefined8 *)((long)ppvVar20 + lVar18 + -0x15e0) = 0;
            free(*(void **)((long)ppvVar20 + lVar18 + -0x12c0));
            *(undefined8 *)((long)ppvVar20 + lVar18 + -0x12c0) = 0;
            free(*(void **)((long)ppvVar20 + lVar18 + -4000));
            *(undefined8 *)((long)ppvVar20 + lVar18 + -4000) = 0;
            free(*(void **)((long)ppvVar20 + lVar18 + -0xc80));
            *(undefined8 *)((long)ppvVar20 + lVar18 + -0xc80) = 0;
            free(*(void **)((long)ppvVar20 + lVar18 + -0x960));
            *(undefined8 *)((long)ppvVar20 + lVar18 + -0x960) = 0;
            free(*(void **)((long)ppvVar20 + lVar18 + -0x640));
            *(undefined8 *)((long)ppvVar20 + lVar18 + -0x640) = 0;
            free(*(void **)((long)ppvVar20 + lVar18 + -800));
            *(undefined8 *)((long)ppvVar20 + lVar18 + -800) = 0;
            free(*(void **)((long)ppvVar20 + lVar18));
            *(undefined8 *)((long)ppvVar20 + lVar18) = 0;
            pvVar13 = *(void **)((long)t + lVar18 + 0x1910);
            if (pvVar13 != (void *)0x0) {
              free(pvVar13);
              *(undefined8 *)((long)t + lVar18 + 0x1910) = 0;
            }
            pvVar13 = *(void **)((long)t + lVar18 + 0x1920);
            if (pvVar13 != (void *)0x0) {
              free(pvVar13);
              *(undefined8 *)((long)t + lVar18 + 0x1920) = 0;
            }
          }
          free(t[lVar15 + 0x195b]);
          t[lVar15 + 0x195b] = (cueify_cdtext)0x0;
          *(undefined1 *)((long)t + lVar15 + 0xca6e) = 0;
          ppvVar20 = ppvVar20 + 1;
        }
        pbVar22 = buffer + iVar23;
        pbVar17 = buffer + 4;
        for (pbVar7 = pbVar17; pbVar7 < pbVar22; pbVar7 = pbVar7 + 0x12) {
          if ((-1 < (char)pbVar7[1]) && ((char)*pbVar7 < -0x70)) {
            pack_sizes[0][(ulong)(pbVar7[3] & 0x70) + (ulong)(*pbVar7 & 0xf)] =
                 pack_sizes[0][(ulong)(pbVar7[3] & 0x70) + (ulong)(*pbVar7 & 0xf)] + 0xc;
          }
        }
        pasVar14 = pack_sizes;
        papuVar6 = pack_data;
        for (lVar15 = 0; pbVar7 = pbVar17, lVar15 != 8; lVar15 = lVar15 + 1) {
          for (lVar18 = 0; lVar18 != 0x10; lVar18 = lVar18 + 1) {
            if ((*pasVar14)[lVar18] != 0) {
              puVar8 = (uchar *)malloc((*pasVar14)[lVar18]);
              (*papuVar6)[lVar18] = puVar8;
              if (puVar8 == (uchar *)0x0) goto LAB_0014eadb;
              (*pasVar14)[lVar18] = 0;
            }
          }
          pasVar14 = pasVar14 + 1;
          papuVar6 = papuVar6 + 1;
        }
        for (; pbVar7 < pbVar22; pbVar7 = pbVar7 + 0x12) {
          if ((-1 < (char)pbVar7[1]) && ((char)*pbVar7 < -0x70)) {
            uVar21 = (ulong)((*pbVar7 & 0xf) << 3);
            uVar16 = (ulong)((pbVar7[3] & 0x70) << 3);
            lVar15 = *(long *)((long)pack_data[0] + uVar21 + uVar16);
            lVar4 = uVar16 - 0x438;
            lVar18 = *(long *)((long)pack_sizes[0] + uVar21 + lVar4 + 0x438);
            *(undefined4 *)(lVar15 + 8 + lVar18) = *(undefined4 *)(pbVar7 + 0xc);
            *(undefined8 *)(lVar15 + lVar18) = *(undefined8 *)(pbVar7 + 4);
            *(long *)((long)pack_sizes[0] + uVar21 + lVar4 + 0x438) = lVar18 + 0xc;
          }
        }
        pbVar7 = (byte *)((long)t + 0xc);
        lVar15 = 0;
        for (lVar18 = 0; lVar18 != 8; lVar18 = lVar18 + 1) {
          if (*(long *)((long)pack_sizes[0] + lVar15 + 0x78) == 0x24) {
            pbVar7[-0xc] = 1;
            pbVar7[-0xb] = 0;
            pbVar7[-10] = 0;
            pbVar7[-9] = 0;
            pbVar2 = *(byte **)((long)pack_data[0] + lVar15 + 0x78);
            pbVar7[-8] = *pbVar2;
            pbVar7[-7] = pbVar2[lVar18 + 0x1c];
            pbVar7[-6] = pbVar2[1];
            pbVar7[-5] = pbVar2[2];
            pbVar7[-4] = pbVar2[3] >> 7;
            pbVar7[-3] = pbVar2[3] >> 6 & 1;
            pbVar7[-2] = pbVar2[3] >> 2 & 1;
            pbVar7[-1] = pbVar2[3] >> 1 & 1;
            *pbVar7 = pbVar2[3] & 1;
          }
          pbVar7 = pbVar7 + 0x1928;
          lVar15 = lVar15 + 0x80;
        }
        for (lVar15 = 0; lVar15 != 8; lVar15 = lVar15 + 1) {
          lVar18 = lVar15 * 0x1928;
          for (uVar21 = 0; uVar21 != 0x10; uVar21 = uVar21 + 1) {
            uVar16 = pack_sizes[lVar15][uVar21];
            if ((uVar16 != 0) && ((uint)uVar21 < 0xf)) {
              iVar23 = (int)uVar16;
              switch(uVar21 & 0xffffffff) {
              default:
                bVar1 = *(byte *)((long)t + lVar18 + 4);
                if (bVar1 < 2) {
                  pcVar9 = latin1_to_utf8(pack_data[lVar15][uVar21],iVar23);
LAB_0014e835:
                  if (pcVar9 == (char *)0x0) goto LAB_0014eadb;
                }
                else {
                  if (bVar1 == 0x80) {
                    pcVar9 = msjis_to_utf8(pack_data[lVar15][uVar21],(int)(uVar16 >> 1));
                    goto LAB_0014e835;
                  }
                  pcVar9 = (char *)0x0;
                }
                switch(uVar21 & 0xffffffff) {
                case 0:
                  local_8c0 = t + lVar15 * 0x325 + 2;
                  break;
                case 1:
                  local_8c0 = t + lVar15 * 0x325 + 0x66;
                  break;
                case 2:
                  local_8c0 = t + lVar15 * 0x325 + 0xca;
                  break;
                case 3:
                  local_8c0 = t + lVar15 * 0x325 + 0x12e;
                  break;
                case 4:
                  local_8c0 = t + lVar15 * 0x325 + 0x192;
                  break;
                case 5:
                  local_8c0 = t + lVar15 * 0x325 + 0x1f6;
                  break;
                case 0xd:
                  local_8c0 = t + lVar15 * 0x325 + 0x25a;
                  break;
                case 0xe:
                  local_8c0 = t + lVar15 * 0x325 + 0x2be;
                }
                if (pcVar9 != (char *)0x0) {
                  pcVar10 = strdup(pcVar9);
                  *local_8c0 = pcVar10;
                  if (pcVar10 == (char *)0x0) goto LAB_0014eadb;
                  uVar16 = (ulong)*(byte *)((long)t + lVar18 + 6);
                  bVar1 = *(byte *)((long)t + lVar18 + 7);
                  pcVar10 = pcVar9;
                  while (uVar16 <= bVar1) {
                    sVar11 = strlen(pcVar10);
                    pcVar10 = pcVar10 + sVar11 + 1;
                    pcVar12 = strdup(pcVar10);
                    local_8c0[uVar16] = pcVar12;
                    uVar16 = uVar16 + 1;
                    if (pcVar12 == (char *)0x0) goto LAB_0014eadb;
                  }
                  free(pcVar9);
                }
                break;
              case 6:
                pcVar9 = latin1_to_utf8(pack_data[lVar15][uVar21],iVar23);
                t[lVar15 * 0x325 + 0x322] = pcVar9;
                break;
              case 7:
                puVar3 = (ushort *)pack_data[lVar15][uVar21];
                uVar5 = *puVar3;
                *(ushort *)(t + lVar15 * 0x325 + 0x323) = uVar5 << 8 | uVar5 >> 8;
                pcVar9 = latin1_to_utf8((uint8_t *)(puVar3 + 1),iVar23 + -2);
                t[lVar15 * 0x325 + 0x324] = pcVar9;
                break;
              case 8:
                pbVar7 = pack_data[lVar15][uVar21];
                uVar16 = (ulong)*pbVar7;
                *(byte *)(t + 0x1928) = *pbVar7;
                bVar1 = pbVar7[1];
                *(byte *)((long)t + 0xc941) = bVar1;
                *(byte *)((long)t + 0xc942) = pbVar7[3];
                *(byte *)((long)t + 0xc943) = pbVar7[4];
                *(byte *)((long)t + 0xc944) = pbVar7[5];
                lVar4 = uVar16 * 3;
                lVar19 = 0;
                for (; uVar16 <= bVar1; uVar16 = uVar16 + 1) {
                  *(byte *)((long)t + lVar19 + lVar4 + 0xc942) = pbVar7[lVar19 + 0xc];
                  *(byte *)((long)t + lVar19 + lVar4 + 0xc943) = pbVar7[lVar19 + 0xd];
                  *(byte *)((long)t + lVar19 + lVar4 + 0xc944) = pbVar7[lVar19 + 0xe];
                  lVar19 = lVar19 + 3;
                }
                break;
              case 9:
              case 10:
              case 0xb:
              case 0xc:
                break;
              }
            }
          }
        }
        for (; pbVar17 < pbVar22; pbVar17 = pbVar17 + 0x12) {
          lVar15 = (long)(char)pbVar17[1];
          if ((-1 < lVar15) && (*pbVar17 == 0x89)) {
            bVar1 = pbVar17[5];
            *(byte *)((long)t + lVar15 + 0xca6e) = bVar1;
            pvVar13 = t[lVar15 + 0x195b];
            if (pvVar13 == (void *)0x0) {
              pvVar13 = malloc((ulong)bVar1 * 6);
              t[lVar15 + 0x195b] = pvVar13;
              if (pvVar13 == (void *)0x0) {
LAB_0014eadb:
                papuVar6 = pack_data;
                for (lVar15 = 0; lVar15 != 8; lVar15 = lVar15 + 1) {
                  for (lVar18 = 0; lVar18 != 0x10; lVar18 = lVar18 + 1) {
                    free((*papuVar6)[lVar18]);
                  }
                  papuVar6 = papuVar6 + 1;
                }
                return 4;
              }
            }
            *(byte *)((long)pvVar13 + (ulong)pbVar17[4] * 6 + -6) = pbVar17[10];
            *(byte *)((long)pvVar13 + (ulong)pbVar17[4] * 6 + -5) = pbVar17[0xb];
            *(byte *)((long)pvVar13 + (ulong)pbVar17[4] * 6 + -4) = pbVar17[0xc];
            *(byte *)((long)pvVar13 + (ulong)pbVar17[4] * 6 + -3) = pbVar17[0xd];
            *(byte *)((long)pvVar13 + (ulong)pbVar17[4] * 6 + -2) = pbVar17[0xe];
            *(byte *)((long)pvVar13 + (ulong)pbVar17[4] * 6 + -1) = pbVar17[0xf];
          }
        }
        papuVar6 = pack_data;
        iVar23 = 0;
        for (lVar15 = 0; lVar15 != 8; lVar15 = lVar15 + 1) {
          for (lVar18 = 0; lVar18 != 0x10; lVar18 = lVar18 + 1) {
            free((*papuVar6)[lVar18]);
          }
          papuVar6 = papuVar6 + 1;
        }
      }
      else {
        iVar23 = 7;
      }
    }
  }
  return iVar23;
}

Assistant:

int cueify_cdtext_deserialize(cueify_cdtext *t, const uint8_t * const buffer,
			      size_t size) {
    cueify_cdtext_private *cdtext = (cueify_cdtext_private *)t;
    uint16_t toc_length;
    const uint8_t *bp;
    int block, pack_type, track;
    unsigned char *pack_data[MAX_BLOCKS][16];
    unsigned char *pack;
    size_t pack_sizes[MAX_BLOCKS][16];
    size_t pack_size;
    struct cdtext_descriptor *descriptor;

    if (t == NULL || buffer == NULL) {
	return CUEIFY_ERR_BADARG;
    }
    if (size < 4) {
	return CUEIFY_ERR_TRUNCATED;
    }

    /* CD-TEXT Data Length */
    toc_length = ((buffer[0] << 8) | buffer[1]);
    if (size - 2 < toc_length) {
	return CUEIFY_ERR_TRUNCATED;
    }
    if ((toc_length - 2) % 18 != 0) {
	return CUEIFY_ERR_CORRUPTED;
    }

    /* Reserved */

    /* Zero out the pack data. */
    for (block = 0; block < MAX_BLOCKS; block++) {
	for (pack_type = 0; pack_type < 16; pack_type++) {
	    pack_data[block][pack_type] = NULL;
	    pack_sizes[block][pack_type] = 0;
	}
    }

    /* Zero out the cdtext data (so it can be freed) */
    for (track = 0; track < MAX_TRACKS; track++) {
	for (block = 0; block < MAX_BLOCKS; block++) {
	    free(cdtext->blocks[block].titles[track]);
	    cdtext->blocks[block].titles[track] = NULL;
	    free(cdtext->blocks[block].performers[track]);
	    cdtext->blocks[block].performers[track] = NULL;
	    free(cdtext->blocks[block].songwriters[track]);
	    cdtext->blocks[block].songwriters[track] = NULL;
	    free(cdtext->blocks[block].composers[track]);
	    cdtext->blocks[block].composers[track] = NULL;
	    free(cdtext->blocks[block].arrangers[track]);
	    cdtext->blocks[block].arrangers[track] = NULL;
	    free(cdtext->blocks[block].messages[track]);
	    cdtext->blocks[block].messages[track] = NULL;
	    free(cdtext->blocks[block].private[track]);
	    cdtext->blocks[block].private[track] = NULL;
	    free(cdtext->blocks[block].upc_isrcs[track]);
	    cdtext->blocks[block].upc_isrcs[track] = NULL;
	    if (cdtext->blocks[block].discid != NULL) {
		free(cdtext->blocks[block].discid);
		cdtext->blocks[block].discid = NULL;
	    }
	    if (cdtext->blocks[block].genre_name != NULL) {
		free(cdtext->blocks[block].genre_name);
		cdtext->blocks[block].genre_name = NULL;
	    }
	}

	free(cdtext->toc.intervals[track]);
	cdtext->toc.intervals[track] = NULL;
	cdtext->toc.num_intervals[track] = 0;
    }

    /* Count all of the PACKs by BLOCK, so we know how much space to
     * allocate. */
    for (bp = buffer + 4; bp < buffer + (toc_length - 2); bp += 18) {
	descriptor = (struct cdtext_descriptor *)bp;

	/* Ignore extension blocks. */
	if (EXTENSION_FLAG(descriptor->track_number) ||
	    descriptor->pack_type < 0x80 ||
	    descriptor->pack_type > 0x8F) {
	    continue;
	}

	pack_sizes[BLOCK_NUMBER(descriptor->block_number)]
	    [descriptor->pack_type - 0x80] += 12;
    }

    /* Allocate the aggregate PACK space. */
    for (block = 0; block < MAX_BLOCKS; block++) {
	for (pack_type = 0; pack_type < 16; pack_type++) {
	    if (pack_sizes[block][pack_type] > 0) {
		pack_data[block][pack_type] =
		    malloc(pack_sizes[block][pack_type]);
		if (pack_data[block][pack_type] == NULL) {
		    goto error;
		}
		/* Reset the size count, so that we can use it as a pointer. */
		pack_sizes[block][pack_type] = 0;
	    }
	}
    }

    /* Aggregate all PACKs. */
    /* NOTE: We assume that PACKs in a given PACK type are in order!! */
    for (bp = buffer + 4; bp < buffer + (toc_length - 2); bp += 18) {
	descriptor = (struct cdtext_descriptor *)bp;

	/* Ignore extension blocks. */
	if (EXTENSION_FLAG(descriptor->track_number) ||
	    descriptor->pack_type < 0x80 ||
	    descriptor->pack_type > 0x8F) {
	    continue;
	}

	block = BLOCK_NUMBER(descriptor->block_number);
	pack_type = descriptor->pack_type - 0x80;

	pack = pack_data[block][pack_type];
	pack_size = pack_sizes[block][pack_type];
	memcpy(pack + pack_size, descriptor->data, 12);
	pack_sizes[block][pack_type] += 12;
	/* TODO: Check CRC */
    }

    /*
     * Now that we have collected all of the PACKs by BLOCK and type,
     * parse the size information PACKs to get the character code,
     * track, and language code info.
     */
    for (block = 0; block < MAX_BLOCKS; block++) {
	/* Don't know how to handle any other size of the size
	 * information block! */
	if (pack_sizes[block][15] != 36) {
	    continue;
	}

	cdtext->blocks[block].valid = 1;
	cdtext->blocks[block].charset = pack_data[block][15][0];
	/* NOTE: This might not work if the language codes aren't in
	 * EVERY info block */
	cdtext->blocks[block].language = pack_data[block][15][block + 28];
	cdtext->blocks[block].first_track_number = pack_data[block][15][1];
	cdtext->blocks[block].last_track_number = pack_data[block][15][2];
	cdtext->blocks[block].program_cdtext =
	    (pack_data[block][15][3] >> 7) & 1;
	cdtext->blocks[block].program_copyright =
	    (pack_data[block][15][3] >> 6) & 1;
	cdtext->blocks[block].message_copyright =
	    (pack_data[block][15][3] >> 2) & 1;
	cdtext->blocks[block].name_copyright =
	    (pack_data[block][15][3] >> 1) & 1;
	cdtext->blocks[block].title_copyright =
	    (pack_data[block][15][3]) & 1;
    }

    for (block = 0; block < MAX_BLOCKS; block++) {
	for (pack_type = 0; pack_type < 16; pack_type++) {
	    if (pack_sizes[block][pack_type] > 0) {
		char **datum;
		char *data = NULL, *data_ptr = NULL;

		switch (pack_type) {
		case 0:   /* 0x80 = TITLE */
		case 1:   /* 0x81 = PERFORMER */
		case 2:   /* 0x82 = SONGWRITER */
		case 3:   /* 0x83 = COMPOSER */
		case 4:   /* 0x84 = ARRANGER */
		case 5:   /* 0x85 = MESSAGE */
		case 13:  /* 0x8D = PRIVATE */
		case 14:  /* 0x8E = UPC/ISRC */
		    /* Textual track-wise PACKs. */

		    /* Decode the PACK contents. */
		    data = NULL;
		    switch (cdtext->blocks[block].charset) {
		    case CUEIFY_CDTEXT_CHARSET_ASCII:
		    case CUEIFY_CDTEXT_CHARSET_ISO8859_1:
			data = latin1_to_utf8(pack_data[block][pack_type],
					      pack_sizes[block][pack_type]);
			if (data == NULL) {
			    goto error;
			}
			break;
		    case CUEIFY_CDTEXT_CHARSET_MSJIS:
			/* NOTE: MS-JIS is a two-byte encoding. */
			data = msjis_to_utf8(pack_data[block][pack_type],
					     pack_sizes[block][pack_type] / 2);
			if (data == NULL) {
			    goto error;
			}
			break;
		    default:
			/* Ignore! */
			break;
		    }

		    /* Split data by track. */
		    switch (pack_type) {
		    case 0:   /* 0x80 = TITLE */
			datum = cdtext->blocks[block].titles;
			break;
		    case 1:   /* 0x81 = PERFORMER */
			datum = cdtext->blocks[block].performers;
			break;
		    case 2:   /* 0x82 = SONGWRITER */
			datum = cdtext->blocks[block].songwriters;
			break;
		    case 3:   /* 0x83 = COMPOSER */
			datum = cdtext->blocks[block].composers;
			break;
		    case 4:   /* 0x84 = ARRANGER */
			datum = cdtext->blocks[block].arrangers;
			break;
		    case 5:   /* 0x85 = MESSAGE */
			datum = cdtext->blocks[block].messages;
			break;
		    /* NOTE: 0x8D/0x8E probably break in MS-JIS!! */
		    case 13:  /* 0x8D = PRIVATE */
			datum = cdtext->blocks[block].private;
			break;
		    case 14:  /* 0x8E = UPC/ISRC */
			datum = cdtext->blocks[block].upc_isrcs;
			break;
		    default:
			break;
		    }

		    /* Copy the decoded text */
		    /* NOTE: This is probably broken for things which
		     * skip tracks. */
		    if (data != NULL) {
			data_ptr = data;
			/* First do the album-wide value. */
			datum[0] = strdup(data_ptr);
			if (datum[0] == NULL) {
			    /* Failed to strdup */
			    goto error;
			}
			/* NOTE: We assume all tracks are included! */
			for (track = cdtext->blocks[block].first_track_number;
			     track <= cdtext->blocks[block].last_track_number;
			     track++) {
			    /* Skip to next track entry. */
			    data_ptr += strlen(data_ptr) + 1;
			    datum[track] = strdup(data_ptr);
			    if (datum[track] == NULL) {
				/* Failed to strdup */
				goto error;
			    }
			}

			/* All done with the decoded value. We can free it. */
			free(data);
		    }
		    break;
		case 6:   /* 0x86 = DISCID */
		    /* According to Red Book, only ISO 8859-1 may be used. */
		    cdtext->blocks[block].discid =
			latin1_to_utf8(pack_data[block][pack_type],
				       pack_sizes[block][pack_type]);
		    break;
		case 7:   /* 0x87 = GENRE */
		    /* Genre includes a genre code in addition to text. */
		    cdtext->blocks[block].genre_code =
			((uint16_t)pack_data[block][pack_type][0] << 8) |
			((uint16_t)pack_data[block][pack_type][1]);
		    /* No particular reason to believe this is Latin1 only?? */
		    cdtext->blocks[block].genre_name =
			latin1_to_utf8(pack_data[block][pack_type] + 2,
				       pack_sizes[block][pack_type] - 2);
		    break;
		case 8:   /* 0x88 = TOCINFO */
		    /* This basically encodes another (short) TOC. */
		    /* NOTE: We assume that the TOC only occurs once. */
		    cdtext->toc.first_track_number =
			pack_data[block][pack_type][0];
		    cdtext->toc.last_track_number =
			pack_data[block][pack_type][1];
		    cdtext->toc.offsets[0].min =
			pack_data[block][pack_type][3];
		    cdtext->toc.offsets[0].sec =
			pack_data[block][pack_type][4];
		    cdtext->toc.offsets[0].frm =
			pack_data[block][pack_type][5];
		    /* NOTE: We assume that the tracks are contiguous
		     * in increasing order. */
		    for (track = cdtext->toc.first_track_number;
			 track <= cdtext->toc.last_track_number;
			 track++) {
			cdtext->toc.offsets[track].min =
			    pack_data[block][pack_type]
			    [12+(track - cdtext->toc.first_track_number)*3];
			cdtext->toc.offsets[track].sec =
			    pack_data[block][pack_type]
			    [12+(track - cdtext->toc.first_track_number)*3+1];
			cdtext->toc.offsets[track].frm =
			    pack_data[block][pack_type]
			    [12+(track - cdtext->toc.first_track_number)*3+2];
		    }
		    break;
		case 9:   /* 0x89 = TOCINFO2 */
		    /* Need the track number from the PACK, so we
		     * ignore and handle later. */
		case 15:  /* 0x8F = SIZEINFO */
		default:
		    /* Ignore! */
		    break;
		}
	    }
	}
    }

    /* Finally, we go back and do the TOCINFO2 packets. */
    for (bp = buffer + 4; bp < buffer + (toc_length - 2); bp += 18) {
	descriptor = (struct cdtext_descriptor *)bp;

	/* Ignore extension blocks. */
	if (EXTENSION_FLAG(descriptor->track_number) ||
	    descriptor->pack_type < 0x80 ||
	    descriptor->pack_type > 0x8F) {
	    continue;
	}

	block = BLOCK_NUMBER(descriptor->block_number);
	pack_type = descriptor->pack_type;

	/* NOTE: We assume that the TOC-2 only occurs once. */
	if (pack_type == 0x89) {
	    track = TRACK_NUMBER(descriptor->track_number);

	    cdtext->toc.num_intervals[track] = descriptor->data[1];
	    if (cdtext->toc.intervals[track] == NULL) {
		cdtext->toc.intervals[track] =
		    malloc(cdtext->toc.num_intervals[track] *
			   sizeof(cueify_cdtext_toc_track_interval_private));
		if (cdtext->toc.intervals[track] == NULL) {
		    goto error;
		}
	    }

	    cdtext->toc.intervals[track][descriptor->data[0] - 1].start.min =
		descriptor->data[6];
	    cdtext->toc.intervals[track][descriptor->data[0] - 1].start.sec =
		descriptor->data[7];
	    cdtext->toc.intervals[track][descriptor->data[0] - 1].start.frm =
		descriptor->data[8];
	    cdtext->toc.intervals[track][descriptor->data[0] - 1].end.min =
		descriptor->data[9];
	    cdtext->toc.intervals[track][descriptor->data[0] - 1].end.sec =
		descriptor->data[10];
	    cdtext->toc.intervals[track][descriptor->data[0] - 1].end.frm =
		descriptor->data[11];
	}
    }

    for (block = 0; block < MAX_BLOCKS; block++) {
	for (pack_type = 0; pack_type < 16; pack_type++) {
	    free(pack_data[block][pack_type]);
	}
    }

    return CUEIFY_OK;

error:
    for (block = 0; block < MAX_BLOCKS; block++) {
	for (pack_type = 0; pack_type < 16; pack_type++) {
	    free(pack_data[block][pack_type]);
	}
    }

    /* Almost always a memory error. */
    return CUEIFY_ERR_NOMEM;
}